

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<float>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  float *pfVar2;
  float fVar3;
  _Optional_payload_base<float> local_30;
  Optional<float> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  opt.super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>.
  _M_payload = (_Storage<float,_true>)indent;
  opt.super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>._7_1_ =
       fixed;
  if (fixed) {
    fVar3 = Struct::GetField<float>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<float>(this,fVar3,&(fd->value).type,
                       (int)opt.super__Optional_base<float,_true,_true>._M_payload.
                            super__Optional_payload_base<float>._M_payload);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      local_30 = (_Optional_payload_base<float>)
                 Table::GetOptional<float,float>(table,(fd->value).offset);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30);
      if (bVar1) {
        pfVar2 = std::optional<float>::operator*((optional<float> *)&local_30);
        PrintScalar<float>(this,*pfVar2,&(fd->value).type,
                           (int)opt.super__Optional_base<float,_true,_true>._M_payload.
                                super__Optional_payload_base<float>._M_payload);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      fVar3 = GetFieldDefault<float>(fd);
      fVar3 = Table::GetField<float>(table,field,fVar3);
      PrintScalar<float>(this,fVar3,&(fd->value).type,
                         (int)opt.super__Optional_base<float,_true,_true>._M_payload.
                              super__Optional_payload_base<float>._M_payload);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }